

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecNum::_setTo(DecNum *this,char *str,int32_t maxDigits,UErrorCode *status)

{
  decNumber *pdVar1;
  UErrorCode *status_local;
  int32_t maxDigits_local;
  char *str_local;
  DecNum *this_local;
  
  if (maxDigits < 0x23) {
    (this->fContext).digits = 0x22;
  }
  else {
    MaybeStackHeaderAndArray<decNumber,_char,_34>::resize(&this->fData,maxDigits,0);
    (this->fContext).digits = maxDigits;
  }
  pdVar1 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getAlias(&this->fData);
  uprv_decNumberFromString_63(pdVar1,str,&this->fContext);
  if (((this->fContext).status & 1) == 0) {
    if ((this->fContext).status == 0) {
      pdVar1 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getAlias(&this->fData);
      if ((pdVar1->bits & 0x70) != 0) {
        *status = U_UNSUPPORTED_ERROR;
      }
    }
    else {
      *status = U_UNSUPPORTED_ERROR;
    }
  }
  else {
    *status = U_DECIMAL_NUMBER_SYNTAX_ERROR;
  }
  return;
}

Assistant:

void DecNum::_setTo(const char* str, int32_t maxDigits, UErrorCode& status) {
    if (maxDigits > kDefaultDigits) {
        fData.resize(maxDigits, 0);
        fContext.digits = maxDigits;
    } else {
        fContext.digits = kDefaultDigits;
    }

    static_assert(DECDPUN == 1, "Assumes that DECDPUN is set to 1");
    uprv_decNumberFromString(fData.getAlias(), str, &fContext);

    // Check for invalid syntax and set the corresponding error code.
    if ((fContext.status & DEC_Conversion_syntax) != 0) {
        status = U_DECIMAL_NUMBER_SYNTAX_ERROR;
        return;
    } else if (fContext.status != 0) {
        // Not a syntax error, but some other error, like an exponent that is too large.
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    // For consistency with Java BigDecimal, no support for DecNum that is NaN or Infinity!
    if (decNumberIsSpecial(fData.getAlias())) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }
}